

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

void duckdb::MedianAbsoluteDeviationOperation<double>::
     Finalize<double,duckdb::QuantileState<double,duckdb::QuantileStandardType>>
               (QuantileState<double,_duckdb::QuantileStandardType> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  reference pvVar2;
  double *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar3;
  MadAccessor<double,_double,_double> accessor;
  double med;
  Interpolator<false> interp;
  value_type *q;
  QuantileBindData *bind_data;
  size_type in_stack_ffffffffffffff88;
  MadAccessor<double,_double,_double> in_stack_ffffffffffffff90;
  QuantileValue *in_stack_ffffffffffffff98;
  Interpolator<false> *in_stack_ffffffffffffffa0;
  AggregateFinalizeData *in_stack_ffffffffffffffd0;
  undefined1 desc_p;
  
  bVar1 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffd0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff90.median);
    FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffff90.median);
    pvVar2 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffff90.median,
                        in_stack_ffffffffffffff88);
    desc_p = (undefined1)((ulong)pvVar2 >> 0x38);
    std::vector<double,_std::allocator<double>_>::size(in_RDI);
    Interpolator<false>::Interpolator
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (idx_t)in_stack_ffffffffffffff90.median,(bool)desc_p);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0xaccaa4);
    Interpolator<false>::Operation<double,double,duckdb::QuantileDirect<double>>
              ((Interpolator<false> *)interp.CRN,(double *)interp.FRN,(Vector *)interp.RN,
               (QuantileDirect<double> *)interp._0_8_);
    MadAccessor<double,_double,_double>::MadAccessor
              ((MadAccessor<double,_double,_double> *)&stack0xffffffffffffff90,
               (double *)&stack0xffffffffffffffa0);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0xaccadd);
    dVar3 = Interpolator<false>::Operation<double,double,duckdb::MadAccessor<double,double,double>>
                      ((Interpolator<false> *)interp.end,(double *)interp.begin,(Vector *)interp.CRN
                       ,(MadAccessor<double,_double,_double> *)interp.FRN);
    *in_RSI = dVar3;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}